

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O1

int wstatus_to_exit_status(pid_t pid,int wstatus)

{
  uint uVar1;
  char *__format;
  
  if ((wstatus & 0x7fU) == 0) {
    uVar1 = (uint)wstatus >> 8 & 0xff;
  }
  else {
    if ((int)((wstatus & 0x7fU) * 0x1000000 + 0x1000000) < 0x2000000) {
      __assert_fail("WIFEXITED(wstatus) || WIFSIGNALED(wstatus)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/proc.c"
                    ,0x24,"int wstatus_to_exit_status(pid_t, int)");
    }
    if ((char)wstatus < '\0') {
      __format = "Process %d core dumped (signal: %d)\n";
    }
    else {
      __format = "Process %d was stopped by signal %d\n";
    }
    fprintf(_stderr,__format,pid);
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

static int wstatus_to_exit_status(pid_t pid, int wstatus) {
    int result = EXIT_FAILURE;
    assert(WIFEXITED(wstatus) || WIFSIGNALED(wstatus));

    if (WIFEXITED(wstatus)) {
        result = WEXITSTATUS(wstatus);
    } else if (WIFSIGNALED(wstatus)) {
        if (WCOREDUMP(wstatus)) {
            fprintf(stderr, "Process %d core dumped (signal: %d)\n", pid,
                    WTERMSIG(wstatus));
            result = EXIT_FAILURE;
        } else {
            fprintf(stderr, "Process %d was stopped by signal %d\n", pid,
                    WTERMSIG(wstatus));
            result = EXIT_FAILURE;
        }
    }

    return result;
}